

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

shared_ptr<bytecode::CompiledFile> __thiscall
compiler::CompilerAstWalker::ConstructCompiledFile(CompilerAstWalker *this)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<bytecode::CompiledFile> sVar4;
  Function local_a8;
  _Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_> local_68;
  _Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> local_48;
  
  plVar1 = *(long **)(in_RSI + 0x128);
  lVar2 = *plVar1;
  lVar3 = plVar1[1];
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::vector
            ((vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> *)&local_48,
             (vector<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_> *)(plVar1 + 10));
  local_a8.localsCount = (lVar3 - lVar2) / 0x28;
  local_a8.argumentCount = 0;
  local_a8.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.closures.
  super__Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_start = local_48._M_impl.super__Vector_impl_data._M_start;
  local_a8.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_finish = local_48._M_impl.super__Vector_impl_data._M_finish;
  local_a8.byteCode.super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  make_shared<bytecode::CompiledFile,bytecode::Function,std::vector<bytecode::Function,std::allocator<bytecode::Function>>&,std::vector<bytecode::ObjectConstructor,std::allocator<bytecode::ObjectConstructor>>&,std::vector<long,std::allocator<long>>&,std::vector<double,std::allocator<double>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((Function *)this,
             (vector<bytecode::Function,_std::allocator<bytecode::Function>_> *)&local_a8,
             (vector<bytecode::ObjectConstructor,_std::allocator<bytecode::ObjectConstructor>_> *)
             (in_RSI + 8),(vector<long,_std::allocator<long>_> *)(in_RSI + 0x20),
             (vector<double,_std::allocator<double>_> *)(in_RSI + 0x38),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RSI + 0x88));
  bytecode::Function::~Function(&local_a8);
  std::_Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>::~_Vector_base
            (&local_48);
  std::_Vector_base<bytecode::ClosureContext,_std::allocator<bytecode::ClosureContext>_>::
  ~_Vector_base(&local_68);
  sVar4.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<bytecode::CompiledFile>)
         sVar4.super___shared_ptr<bytecode::CompiledFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<bytecode::CompiledFile> ConstructCompiledFile() noexcept {
    return std::make_shared<bytecode::CompiledFile>(
      bytecode::Function{ 0, this->ec->variables.size(), {}, this->ec->byteCode },
      this->functions,
      this->objects,
      this->intConstants,
      this->floatConstants,
      this->stringConstants
    );
  }